

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

int __thiscall cmCTestScriptHandler::ExtractVariables(cmCTestScriptHandler *this)

{
  string *dir;
  string *dir_00;
  cmMakefile *pcVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  cmValue cVar7;
  char *__s;
  char *pcVar8;
  uint uVar9;
  double dVar10;
  cmAlphaNum local_118;
  cmAlphaNum local_e8;
  string *local_b8;
  string *local_b0;
  string *local_a8;
  string *local_a0;
  string *local_98;
  string *local_90;
  char *local_88;
  pointer local_80;
  string msg;
  char updateVar [40];
  
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CTEST_SOURCE_DIRECTORY",(allocator<char> *)&local_e8);
  cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_118);
  dir = &this->SourceDir;
  std::__cxx11::string::_M_assign((string *)dir);
  std::__cxx11::string::~string((string *)&local_118);
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CTEST_BINARY_DIRECTORY",(allocator<char> *)&local_e8);
  cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_118);
  dir_00 = &this->BinaryDir;
  std::__cxx11::string::_M_assign((string *)dir_00);
  std::__cxx11::string::~string((string *)&local_118);
  cmsys::SystemTools::AddKeepPath(dir);
  local_a0 = dir_00;
  cmsys::SystemTools::AddKeepPath(dir_00);
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CTEST_COMMAND",(allocator<char> *)&local_e8);
  cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_118);
  local_a8 = &this->CTestCmd;
  std::__cxx11::string::_M_assign((string *)local_a8);
  std::__cxx11::string::~string((string *)&local_118);
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CTEST_CVS_CHECKOUT",(allocator<char> *)&local_e8);
  cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_118);
  std::__cxx11::string::_M_assign((string *)&this->CVSCheckOut);
  std::__cxx11::string::~string((string *)&local_118);
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CTEST_DASHBOARD_ROOT",(allocator<char> *)&local_e8);
  cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_118);
  std::__cxx11::string::_M_assign((string *)&this->CTestRoot);
  std::__cxx11::string::~string((string *)&local_118);
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CTEST_UPDATE_COMMAND",(allocator<char> *)&local_e8);
  cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_118);
  std::__cxx11::string::_M_assign((string *)&this->UpdateCmd);
  std::__cxx11::string::~string((string *)&local_118);
  if ((this->UpdateCmd)._M_string_length == 0) {
    pcVar1 = (this->Makefile)._M_t.
             super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"CTEST_CVS_COMMAND",(allocator<char> *)&local_e8);
    cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_118);
    std::__cxx11::string::_M_assign((string *)&this->UpdateCmd);
    std::__cxx11::string::~string((string *)&local_118);
  }
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CTEST_ENVIRONMENT",(allocator<char> *)&local_e8);
  cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_118);
  std::__cxx11::string::_M_assign((string *)&this->CTestEnv);
  std::__cxx11::string::~string((string *)&local_118);
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CTEST_INITIAL_CACHE",(allocator<char> *)&local_e8);
  cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_118);
  std::__cxx11::string::_M_assign((string *)&this->InitialCache);
  std::__cxx11::string::~string((string *)&local_118);
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CTEST_CMAKE_COMMAND",(allocator<char> *)&local_e8);
  cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_118);
  std::__cxx11::string::_M_assign((string *)&this->CMakeCmd);
  std::__cxx11::string::~string((string *)&local_118);
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CTEST_CMAKE_OUTPUT_FILE_NAME",(allocator<char> *)&local_e8);
  cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_118);
  std::__cxx11::string::_M_assign((string *)&this->CMOutFile);
  std::__cxx11::string::~string((string *)&local_118);
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CTEST_BACKUP_AND_RESTORE",(allocator<char> *)&local_e8);
  bVar5 = cmMakefile::IsOn(pcVar1,(string *)&local_118);
  this->Backup = bVar5;
  std::__cxx11::string::~string((string *)&local_118);
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CTEST_START_WITH_EMPTY_BINARY_DIRECTORY",
             (allocator<char> *)&local_e8);
  bVar5 = cmMakefile::IsOn(pcVar1,(string *)&local_118);
  this->EmptyBinDir = bVar5;
  std::__cxx11::string::~string((string *)&local_118);
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CTEST_START_WITH_EMPTY_BINARY_DIRECTORY_ONCE",
             (allocator<char> *)&local_e8);
  bVar5 = cmMakefile::IsOn(pcVar1,(string *)&local_118);
  this->EmptyBinDirOnce = bVar5;
  std::__cxx11::string::~string((string *)&local_118);
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CTEST_CONTINUOUS_MINIMUM_INTERVAL",(allocator<char> *)&local_e8);
  cVar7 = cmMakefile::GetDefinition(pcVar1,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CTEST_CONTINUOUS_DURATION",(allocator<char> *)&local_e8);
  local_b8 = dir;
  local_b0 = (string *)&this->CTestRoot;
  local_90 = cVar7.Value;
  local_98 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  uVar9 = 1;
  do {
    if (uVar9 == 10) {
      if ((this->Backup == true) && ((this->CVSCheckOut)._M_string_length == 0)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,
                   "Backup was requested without specifying CTEST_CVS_CHECKOUT.",
                   (allocator<char> *)&local_e8);
        cmSystemTools::Error((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        iVar6 = 3;
      }
      else {
        sVar2 = (this->SourceDir)._M_string_length;
        sVar3 = (this->BinaryDir)._M_string_length;
        sVar4 = (this->CTestCmd)._M_string_length;
        if (sVar4 == 0 || (sVar3 == 0 || sVar2 == 0)) {
          local_118.View_._M_len = 0x19;
          local_118.View_._M_str = "CTEST_SOURCE_DIRECTORY = ";
          pcVar8 = "(Null)";
          __s = "(Null)";
          if (sVar2 != 0) {
            __s = (local_b8->_M_dataplus)._M_p;
          }
          local_e8.View_._M_len = strlen(__s);
          local_88 = "(Null)";
          if (sVar3 != 0) {
            local_88 = (local_a0->_M_dataplus)._M_p;
          }
          if (sVar4 != 0) {
            pcVar8 = (local_a8->_M_dataplus)._M_p;
          }
          local_e8.View_._M_str = __s;
          local_80 = pcVar8;
          cmStrCat<char[27],char_const*,char[18],char_const*>
                    (&msg,&local_118,&local_e8,(char (*) [27])"\nCTEST_BINARY_DIRECTORY = ",
                     &local_88,(char (*) [18])"\nCTEST_COMMAND = ",&local_80);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_118,
                         "Some required settings in the configuration file were missing:\n",&msg);
          cmSystemTools::Error((string *)&local_118);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&msg);
          iVar6 = 4;
        }
        else {
          if ((this->CTestRoot)._M_string_length == 0) {
            cmsys::SystemTools::GetFilenamePath((string *)&local_118,local_b8);
            std::__cxx11::string::operator=(local_b0,(string *)&local_118);
            std::__cxx11::string::~string((string *)&local_118);
          }
          if (local_90 != (string *)0x0) {
            dVar10 = atof((local_90->_M_dataplus)._M_p);
            this->MinimumInterval = dVar10 * 60.0;
          }
          if (local_98 != (string *)0x0) {
            dVar10 = atof((local_98->_M_dataplus)._M_p);
            this->ContinuousDuration = dVar10 * 60.0;
          }
          UpdateElapsedTime(this);
          iVar6 = 0;
        }
      }
      return iVar6;
    }
    snprintf(updateVar,0x28,"CTEST_EXTRA_UPDATES_%i",(ulong)uVar9);
    pcVar1 = (this->Makefile)._M_t.
             super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,updateVar,(allocator<char> *)&local_e8);
    cVar7 = cmMakefile::GetDefinition(pcVar1,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    if (cVar7.Value != (string *)0x0) {
      if ((this->UpdateCmd)._M_string_length == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,updateVar,(allocator<char> *)&msg);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_118,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_e8," specified without specifying CTEST_CVS_COMMAND.");
        cmSystemTools::Error((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_e8);
        return 0xc;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->ExtraUpdates,cVar7.Value);
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

int cmCTestScriptHandler::ExtractVariables()
{
  // Temporary variables
  cmValue minInterval;
  cmValue contDuration;

  this->SourceDir =
    this->Makefile->GetSafeDefinition("CTEST_SOURCE_DIRECTORY");
  this->BinaryDir =
    this->Makefile->GetSafeDefinition("CTEST_BINARY_DIRECTORY");

  // add in translations for src and bin
  cmSystemTools::AddKeepPath(this->SourceDir);
  cmSystemTools::AddKeepPath(this->BinaryDir);

  this->CTestCmd = this->Makefile->GetSafeDefinition("CTEST_COMMAND");
  this->CVSCheckOut = this->Makefile->GetSafeDefinition("CTEST_CVS_CHECKOUT");
  this->CTestRoot = this->Makefile->GetSafeDefinition("CTEST_DASHBOARD_ROOT");
  this->UpdateCmd = this->Makefile->GetSafeDefinition("CTEST_UPDATE_COMMAND");
  if (this->UpdateCmd.empty()) {
    this->UpdateCmd = this->Makefile->GetSafeDefinition("CTEST_CVS_COMMAND");
  }
  this->CTestEnv = this->Makefile->GetSafeDefinition("CTEST_ENVIRONMENT");
  this->InitialCache =
    this->Makefile->GetSafeDefinition("CTEST_INITIAL_CACHE");
  this->CMakeCmd = this->Makefile->GetSafeDefinition("CTEST_CMAKE_COMMAND");
  this->CMOutFile =
    this->Makefile->GetSafeDefinition("CTEST_CMAKE_OUTPUT_FILE_NAME");

  this->Backup = this->Makefile->IsOn("CTEST_BACKUP_AND_RESTORE");
  this->EmptyBinDir =
    this->Makefile->IsOn("CTEST_START_WITH_EMPTY_BINARY_DIRECTORY");
  this->EmptyBinDirOnce =
    this->Makefile->IsOn("CTEST_START_WITH_EMPTY_BINARY_DIRECTORY_ONCE");

  minInterval =
    this->Makefile->GetDefinition("CTEST_CONTINUOUS_MINIMUM_INTERVAL");
  contDuration = this->Makefile->GetDefinition("CTEST_CONTINUOUS_DURATION");

  char updateVar[40];
  int i;
  for (i = 1; i < 10; ++i) {
    snprintf(updateVar, sizeof(updateVar), "CTEST_EXTRA_UPDATES_%i", i);
    cmValue updateVal = this->Makefile->GetDefinition(updateVar);
    if (updateVal) {
      if (this->UpdateCmd.empty()) {
        cmSystemTools::Error(
          std::string(updateVar) +
          " specified without specifying CTEST_CVS_COMMAND.");
        return 12;
      }
      this->ExtraUpdates.emplace_back(*updateVal);
    }
  }

  // in order to backup and restore we also must have the cvs root
  if (this->Backup && this->CVSCheckOut.empty()) {
    cmSystemTools::Error(
      "Backup was requested without specifying CTEST_CVS_CHECKOUT.");
    return 3;
  }

  // make sure the required info is here
  if (this->SourceDir.empty() || this->BinaryDir.empty() ||
      this->CTestCmd.empty()) {
    std::string msg =
      cmStrCat("CTEST_SOURCE_DIRECTORY = ",
               (!this->SourceDir.empty()) ? this->SourceDir.c_str() : "(Null)",
               "\nCTEST_BINARY_DIRECTORY = ",
               (!this->BinaryDir.empty()) ? this->BinaryDir.c_str() : "(Null)",
               "\nCTEST_COMMAND = ",
               (!this->CTestCmd.empty()) ? this->CTestCmd.c_str() : "(Null)");
    cmSystemTools::Error(
      "Some required settings in the configuration file were missing:\n" +
      msg);
    return 4;
  }

  // if the dashboard root isn't specified then we can compute it from the
  // this->SourceDir
  if (this->CTestRoot.empty()) {
    this->CTestRoot = cmSystemTools::GetFilenamePath(this->SourceDir);
  }

  // the script may override the minimum continuous interval
  if (minInterval) {
    this->MinimumInterval = 60 * atof(minInterval->c_str());
  }
  if (contDuration) {
    this->ContinuousDuration = 60.0 * atof(contDuration->c_str());
  }

  this->UpdateElapsedTime();

  return 0;
}